

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucol_res.cpp
# Opt level: O3

int32_t ucol_getDisplayName_63
                  (char *objLoc,char *dispLoc,UChar *result,int32_t resultLength,UErrorCode *status)

{
  int32_t iVar1;
  UnicodeString dst;
  Char16Ptr local_248;
  UChar *local_240;
  UnicodeString local_230;
  Locale local_1f0;
  Locale local_110;
  
  iVar1 = -1;
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    local_230.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003e4fd8;
    local_230.fUnion.fStackFields.fLengthAndFlags = 2;
    if (result != (UChar *)0x0 || resultLength != 0) {
      icu_63::UnicodeString::setTo(&local_230,result,0,resultLength);
    }
    icu_63::Locale::Locale(&local_110,objLoc,(char *)0x0,(char *)0x0,(char *)0x0);
    icu_63::Locale::Locale(&local_1f0,dispLoc,(char *)0x0,(char *)0x0,(char *)0x0);
    icu_63::Collator::getDisplayName(&local_110,&local_1f0,&local_230);
    icu_63::Locale::~Locale(&local_1f0);
    icu_63::Locale::~Locale(&local_110);
    local_248.p_ = result;
    iVar1 = icu_63::UnicodeString::extract(&local_230,&local_248,resultLength,status);
    local_240 = local_248.p_;
    icu_63::UnicodeString::~UnicodeString(&local_230);
  }
  return iVar1;
}

Assistant:

U_CAPI int32_t U_EXPORT2
ucol_getDisplayName(    const    char        *objLoc,
                    const    char        *dispLoc,
                    UChar             *result,
                    int32_t         resultLength,
                    UErrorCode        *status)
{
    if(U_FAILURE(*status)) return -1;
    UnicodeString dst;
    if(!(result==NULL && resultLength==0)) {
        // NULL destination for pure preflighting: empty dummy string
        // otherwise, alias the destination buffer
        dst.setTo(result, 0, resultLength);
    }
    Collator::getDisplayName(Locale(objLoc), Locale(dispLoc), dst);
    return dst.extract(result, resultLength, *status);
}